

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O3

void __thiscall csv::CSVReader::CSVReader(CSVReader *this,string_view filename,CSVFormat *format)

{
  vector<char,_std::allocator<char>_> *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  IBasicCSVParser *pIVar1;
  char cVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ThreadSafeDeque<csv::CSVRow> *this_02;
  CSVGuessResult CVar4;
  MmapParser *this_03;
  element_type *delims;
  string *__return_storage_ptr__;
  string_view head_00;
  string_view filename_00;
  string head;
  string local_50;
  
  filename_00._M_len = filename._M_str;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)this,&format->possible_delimiters);
  this_00 = &(this->_format).trim_chars;
  std::vector<char,_std::allocator<char>_>::vector(this_00,&format->trim_chars);
  cVar2 = format->quote_char;
  (this->_format).no_quote = format->no_quote;
  (this->_format).quote_char = cVar2;
  (this->_format).header = format->header;
  this_01 = &(this->_format).col_names;
  __x = &format->col_names;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this_01,__x);
  (this->_format).variable_column_policy = format->variable_column_policy;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00118bd0;
  delims = (element_type *)(p_Var3 + 1);
  p_Var3[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[2]._M_use_count = 0;
  p_Var3[2]._M_weak_count = 0;
  p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[3]._M_use_count = 0;
  p_Var3[3]._M_weak_count = 0;
  p_Var3[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[4]._M_use_count = 0;
  p_Var3[4]._M_weak_count = 0;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0;
  *(_Atomic_word **)&p_Var3[2]._M_use_count = &p_Var3[5]._M_use_count;
  p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x1;
  p_Var3[3]._M_use_count = 0;
  p_Var3[3]._M_weak_count = 0;
  p_Var3[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[4]._M_use_count = 0x3f800000;
  p_Var3[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[5]._M_use_count = 0;
  p_Var3[5]._M_weak_count = 0;
  (this->col_names).super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  (this->col_names).super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = delims;
  (this->parser)._M_t.
  super___uniq_ptr_impl<csv::internals::IBasicCSVParser,_std::default_delete<csv::internals::IBasicCSVParser>_>
  ._M_t.
  super__Tuple_impl<0UL,_csv::internals::IBasicCSVParser_*,_std::default_delete<csv::internals::IBasicCSVParser>_>
  .super__Head_base<0UL,_csv::internals::IBasicCSVParser_*,_false>._M_head_impl =
       (IBasicCSVParser *)0x0;
  this_02 = (ThreadSafeDeque<csv::CSVRow> *)operator_new(0xb8);
  internals::ThreadSafeDeque<csv::CSVRow>::ThreadSafeDeque(this_02,100);
  (this->records)._M_t.
  super___uniq_ptr_impl<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
  .super__Head_base<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_false>._M_head_impl =
       this_02;
  (this->read_csv_worker)._M_id._M_thread = 0;
  this->n_cols = 0;
  this->_n_rows = 0;
  this->header_trimmed = false;
  __return_storage_ptr__ = &local_50;
  filename_00._M_str = (char *)delims;
  internals::get_csv_head_abi_cxx11_
            (__return_storage_ptr__,(internals *)filename._M_len,filename_00);
  if (1 < (ulong)((long)(format->possible_delimiters).
                        super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(format->possible_delimiters).super__Vector_base<char,_std::allocator<char>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    head_00._M_str = (char *)format;
    head_00._M_len = (size_t)local_50._M_dataplus._M_p;
    CVar4 = internals::_guess_format
                      ((internals *)__return_storage_ptr__,head_00,
                       (vector<char,_std::allocator<char>_> *)delims);
    CSVFormat::delimiter(format,CVar4.delim);
    format->header = CVar4.header_row;
    std::vector<char,_std::allocator<char>_>::operator=
              ((vector<char,_std::allocator<char>_> *)this,&format->possible_delimiters);
    std::vector<char,_std::allocator<char>_>::operator=(this_00,&format->trim_chars);
    cVar2 = format->quote_char;
    (this->_format).no_quote = format->no_quote;
    (this->_format).quote_char = cVar2;
    (this->_format).header = format->header;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(this_01,__x);
    (this->_format).variable_column_policy = format->variable_column_policy;
  }
  if ((format->col_names).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (format->col_names).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    internals::ColNames::set_col_names
              ((this->col_names).
               super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_ptr,__x);
    this->n_cols = (long)(format->col_names).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(format->col_names).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
  }
  this_03 = (MmapParser *)operator_new(0x5c0);
  internals::MmapParser::MmapParser(this_03,filename,format,&this->col_names);
  pIVar1 = (this->parser)._M_t.
           super___uniq_ptr_impl<csv::internals::IBasicCSVParser,_std::default_delete<csv::internals::IBasicCSVParser>_>
           ._M_t.
           super__Tuple_impl<0UL,_csv::internals::IBasicCSVParser_*,_std::default_delete<csv::internals::IBasicCSVParser>_>
           .super__Head_base<0UL,_csv::internals::IBasicCSVParser_*,_false>._M_head_impl;
  (this->parser)._M_t.
  super___uniq_ptr_impl<csv::internals::IBasicCSVParser,_std::default_delete<csv::internals::IBasicCSVParser>_>
  ._M_t.
  super__Tuple_impl<0UL,_csv::internals::IBasicCSVParser_*,_std::default_delete<csv::internals::IBasicCSVParser>_>
  .super__Head_base<0UL,_csv::internals::IBasicCSVParser_*,_false>._M_head_impl =
       (IBasicCSVParser *)this_03;
  if (pIVar1 != (IBasicCSVParser *)0x0) {
    (*pIVar1->_vptr_IBasicCSVParser[1])();
  }
  initial_read(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

CSV_INLINE CSVReader::CSVReader(csv::string_view filename, CSVFormat format) : _format(format) {
        auto head = internals::get_csv_head(filename);
        using Parser = internals::MmapParser;

        /** Guess delimiter and header row */
        if (format.guess_delim()) {
            auto guess_result = internals::_guess_format(head, format.possible_delimiters);
            format.delimiter(guess_result.delim);
            format.header = guess_result.header_row;
            this->_format = format;
        }

        if (!format.col_names.empty())
            this->set_col_names(format.col_names);

        this->parser = std::unique_ptr<Parser>(new Parser(filename, format, this->col_names)); // For C++11
        this->initial_read();
    }